

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O2

void secp256k1_heap_swap(uchar *arr,size_t i,size_t j,size_t stride)

{
  ulong __n;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uchar tmp [64];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  lVar9 = (i + 1) * stride;
  lVar8 = (j + 1) * stride;
  for (lVar10 = 0; __n = stride + lVar10, 0x40 < __n; lVar10 = lVar10 + -0x40) {
    local_68 = *(undefined8 *)(arr + lVar10 + lVar9 + -0x40);
    uStack_60 = *(undefined8 *)(arr + lVar10 + lVar9 + -0x40 + 8);
    local_58 = *(undefined8 *)(arr + lVar10 + lVar9 + -0x30);
    uStack_50 = *(undefined8 *)(arr + lVar10 + lVar9 + -0x30 + 8);
    local_48 = *(undefined8 *)(arr + lVar10 + lVar9 + -0x20);
    uStack_40 = *(undefined8 *)(arr + lVar10 + lVar9 + -0x20 + 8);
    local_38 = *(undefined8 *)(arr + lVar10 + lVar9 + -0x10);
    uStack_30 = *(undefined8 *)(arr + lVar10 + lVar9 + -0x10 + 8);
    uVar1 = *(undefined8 *)(arr + lVar10 + lVar8 + -0x40 + 8);
    uVar2 = *(undefined8 *)(arr + lVar10 + lVar8 + -0x30);
    uVar3 = *(undefined8 *)(arr + lVar10 + lVar8 + -0x30 + 8);
    uVar4 = *(undefined8 *)(arr + lVar10 + lVar8 + -0x20);
    uVar5 = *(undefined8 *)(arr + lVar10 + lVar8 + -0x20 + 8);
    uVar6 = *(undefined8 *)(arr + lVar10 + lVar8 + -0x10);
    uVar7 = *(undefined8 *)(arr + lVar10 + lVar8 + -0x10 + 8);
    *(undefined8 *)(arr + lVar10 + lVar9 + -0x40) = *(undefined8 *)(arr + lVar10 + lVar8 + -0x40);
    *(undefined8 *)(arr + lVar10 + lVar9 + -0x40 + 8) = uVar1;
    *(undefined8 *)(arr + lVar10 + lVar9 + -0x10) = uVar6;
    *(undefined8 *)(arr + lVar10 + lVar9 + -0x10 + 8) = uVar7;
    *(undefined8 *)(arr + lVar10 + lVar9 + -0x20) = uVar4;
    *(undefined8 *)(arr + lVar10 + lVar9 + -0x20 + 8) = uVar5;
    *(undefined8 *)(arr + lVar10 + lVar9 + -0x30) = uVar2;
    *(undefined8 *)(arr + lVar10 + lVar9 + -0x30 + 8) = uVar3;
    *(undefined8 *)(arr + lVar10 + lVar8 + -0x10) = local_38;
    *(undefined8 *)(arr + lVar10 + lVar8 + -0x10 + 8) = uStack_30;
    *(undefined8 *)(arr + lVar10 + lVar8 + -0x20) = local_48;
    *(undefined8 *)(arr + lVar10 + lVar8 + -0x20 + 8) = uStack_40;
    *(undefined8 *)(arr + lVar10 + lVar8 + -0x30) = local_58;
    *(undefined8 *)(arr + lVar10 + lVar8 + -0x30 + 8) = uStack_50;
    *(undefined8 *)(arr + lVar10 + lVar8 + -0x40) = local_68;
    *(undefined8 *)(arr + lVar10 + lVar8 + -0x40 + 8) = uStack_60;
  }
  memcpy(&local_68,arr + stride * i,__n);
  memmove(arr + stride * i,arr + stride * j,__n);
  memcpy(arr + stride * j,&local_68,__n);
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_heap_swap(unsigned char *arr, size_t i, size_t j, size_t stride) {
    unsigned char *a = arr + i*stride;
    unsigned char *b = arr + j*stride;
    size_t len = stride;
    while (64 < len) {
        secp256k1_heap_swap64(a + (len - 64), b + (len - 64), 64);
        len -= 64;
    }
    secp256k1_heap_swap64(a, b, len);
}